

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fts5StructureAddLevel(int *pRc,Fts5Structure **ppStruct)

{
  Fts5StructureLevel *pFVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  Fts5Structure *__dest;
  long lVar4;
  Fts5StructureSegment *__dest_00;
  Fts5Structure *pFVar5;
  int iVar6;
  Fts5StructureSegment **ppFVar7;
  size_t sVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  long lVar11;
  
  if ((*pRc == 0) && (pFVar5 = *ppStruct, 1 < pFVar5->nRef)) {
    sVar8 = (long)pFVar5->nLevel * 0x10 + 0x20;
    __dest = (Fts5Structure *)sqlite3Fts5MallocZero(pRc,sVar8);
    if (__dest != (Fts5Structure *)0x0) {
      memcpy(__dest,pFVar5,sVar8);
      auVar3 = _DAT_002010a0;
      iVar6 = pFVar5->nLevel;
      lVar4 = (long)iVar6;
      bVar2 = 0 < lVar4;
      if (0 < lVar4) {
        lVar4 = lVar4 + -1;
        auVar9._8_4_ = (int)lVar4;
        auVar9._0_8_ = lVar4;
        auVar9._12_4_ = (int)((ulong)lVar4 >> 0x20);
        lVar4 = 0;
        auVar9 = auVar9 ^ _DAT_002010a0;
        auVar10 = _DAT_00201090;
        do {
          auVar12 = auVar10 ^ auVar3;
          if ((bool)(~(auVar12._4_4_ == auVar9._4_4_ && auVar9._0_4_ < auVar12._0_4_ ||
                      auVar9._4_4_ < auVar12._4_4_) & 1)) {
            *(undefined8 *)((long)&__dest->aLevel[0].aSeg + lVar4) = 0;
          }
          if ((auVar12._12_4_ != auVar9._12_4_ || auVar12._8_4_ <= auVar9._8_4_) &&
              auVar12._12_4_ <= auVar9._12_4_) {
            *(undefined8 *)((long)__dest[1].aLevel + lVar4 + -0x18) = 0;
          }
          lVar11 = auVar10._8_8_;
          auVar10._0_8_ = auVar10._0_8_ + 2;
          auVar10._8_8_ = lVar11 + 2;
          lVar4 = lVar4 + 0x20;
        } while ((ulong)(iVar6 + 1U >> 1) << 5 != lVar4);
        if (0 < iVar6) {
          iVar6 = 0;
          bVar2 = true;
          do {
            sVar8 = (long)__dest->aLevel[iVar6].nSeg * 0x38;
            __dest_00 = (Fts5StructureSegment *)sqlite3Fts5MallocZero(pRc,sVar8);
            __dest->aLevel[iVar6].aSeg = __dest_00;
            if (__dest_00 == (Fts5StructureSegment *)0x0) {
              if (pFVar5->nLevel < 1) {
                lVar4 = 0;
              }
              else {
                lVar4 = 0;
                ppFVar7 = &__dest->aLevel[0].aSeg;
                do {
                  sqlite3_free(*ppFVar7);
                  lVar4 = lVar4 + 1;
                  ppFVar7 = ppFVar7 + 2;
                } while (lVar4 < pFVar5->nLevel);
              }
              iVar6 = (int)lVar4;
              sqlite3_free(__dest);
            }
            else {
              memcpy(__dest_00,pFVar5->aLevel[iVar6].aSeg,sVar8);
            }
            if (__dest_00 == (Fts5StructureSegment *)0x0) goto LAB_001e9379;
            iVar6 = iVar6 + 1;
            bVar2 = iVar6 < pFVar5->nLevel;
          } while (iVar6 < pFVar5->nLevel);
        }
      }
      pFVar5->nRef = pFVar5->nRef + -1;
      __dest->nRef = 1;
LAB_001e9379:
      if (bVar2) goto LAB_001e938d;
    }
    *ppStruct = __dest;
  }
LAB_001e938d:
  if (*pRc == 0) {
    pFVar5 = *ppStruct;
    lVar4 = (long)pFVar5->nLevel;
    iVar6 = sqlite3_initialize();
    if (iVar6 == 0) {
      pFVar5 = (Fts5Structure *)sqlite3Realloc(pFVar5,lVar4 * 0x10 + 0x40);
    }
    else {
      pFVar5 = (Fts5Structure *)0x0;
    }
    if (pFVar5 == (Fts5Structure *)0x0) {
      *pRc = 7;
    }
    else {
      pFVar1 = pFVar5->aLevel + lVar4;
      pFVar1->nMerge = 0;
      pFVar1->nSeg = 0;
      pFVar1->aSeg = (Fts5StructureSegment *)0x0;
      pFVar5->nLevel = pFVar5->nLevel + 1;
      *ppStruct = pFVar5;
    }
  }
  return;
}

Assistant:

static void fts5StructureAddLevel(int *pRc, Fts5Structure **ppStruct){
  fts5StructureMakeWritable(pRc, ppStruct);
  assert( (ppStruct!=0 && (*ppStruct)!=0) || (*pRc)!=SQLITE_OK );
  if( *pRc==SQLITE_OK ){
    Fts5Structure *pStruct = *ppStruct;
    int nLevel = pStruct->nLevel;
    sqlite3_int64 nByte = (
        sizeof(Fts5Structure) +                  /* Main structure */
        sizeof(Fts5StructureLevel) * (nLevel+1)  /* aLevel[] array */
    );

    pStruct = sqlite3_realloc64(pStruct, nByte);
    if( pStruct ){
      memset(&pStruct->aLevel[nLevel], 0, sizeof(Fts5StructureLevel));
      pStruct->nLevel++;
      *ppStruct = pStruct;
    }else{
      *pRc = SQLITE_NOMEM;
    }
  }
}